

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O0

int __thiscall
VVCStreamReader::toFullPicOrder(VVCStreamReader *this,VvcSliceHeader *slice,int pic_bits)

{
  bool bVar1;
  int iVar2;
  int range;
  int pic_bits_local;
  VvcSliceHeader *slice_local;
  VVCStreamReader *this_local;
  
  bVar1 = VvcSliceHeader::isIDR(slice);
  if (bVar1) {
    this->m_picOrderBase = this->m_frameNum;
    this->m_picOrderMsb = 0;
    this->m_prevPicOrder = 0;
  }
  else {
    iVar2 = 1 << ((byte)pic_bits & 0x1f);
    if (((int)(uint)slice->pic_order_cnt_lsb < this->m_prevPicOrder) &&
       (iVar2 / 2 <= (int)(this->m_prevPicOrder - (uint)slice->pic_order_cnt_lsb))) {
      this->m_picOrderMsb = iVar2 + this->m_picOrderMsb;
    }
    else if ((this->m_prevPicOrder < (int)(uint)slice->pic_order_cnt_lsb) &&
            (iVar2 / 2 <= (int)((uint)slice->pic_order_cnt_lsb - this->m_prevPicOrder))) {
      this->m_picOrderMsb = this->m_picOrderMsb - iVar2;
    }
    this->m_prevPicOrder = (uint)slice->pic_order_cnt_lsb;
  }
  return (uint)slice->pic_order_cnt_lsb + this->m_picOrderMsb + this->m_picOrderBase;
}

Assistant:

int VVCStreamReader::toFullPicOrder(const VvcSliceHeader* slice, const int pic_bits)
{
    if (slice->isIDR())
    {
        m_picOrderBase = m_frameNum;
        m_picOrderMsb = 0;
        m_prevPicOrder = 0;
    }
    else
    {
        const int range = 1 << pic_bits;

        if (slice->pic_order_cnt_lsb < m_prevPicOrder && m_prevPicOrder - slice->pic_order_cnt_lsb >= range / 2)
            m_picOrderMsb += range;
        else if (slice->pic_order_cnt_lsb > m_prevPicOrder && slice->pic_order_cnt_lsb - m_prevPicOrder >= range / 2)
            m_picOrderMsb -= range;

        m_prevPicOrder = slice->pic_order_cnt_lsb;
    }

    return slice->pic_order_cnt_lsb + m_picOrderMsb + m_picOrderBase;
}